

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

string * gmlc::utilities::stringOps::getTailString_abi_cxx11_(string_view input,char sep)

{
  size_type sVar1;
  char *in_RDX;
  size_t in_RSI;
  string *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_type sepLoc;
  string *ret;
  char in_stack_ffffffffffffff8f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffffa0;
  string *this;
  allocator<char> local_41;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar3;
  
  bVar2._M_str = in_RDX;
  bVar2._M_len = in_RSI;
  this = in_RDI;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f,0x71f3fc);
  uVar3 = 0;
  if (sVar1 != 0xffffffffffffffff) {
    bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)this,(size_type)in_RDI,
                       in_stack_ffffffffffffffa0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar3,in_stack_ffffffffffffffd0),
             (basic_string_view<char,_std::char_traits<char>_> *)bVar2._M_str,
             (allocator<char> *)bVar2._M_len);
  std::allocator<char>::~allocator(&local_41);
  return this;
}

Assistant:

std::string getTailString(std::string_view input, char sep) noexcept
    {
        auto sepLoc = input.find_last_of(sep);
        auto ret = std::string(
            (sepLoc == std::string::npos) ? input : input.substr(sepLoc + 1));
        return ret;
    }